

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O2

int * __thiscall Fl_Group::sizes(Fl_Group *this)

{
  Fl_Group *pFVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  Fl_Widget ***pppFVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  
  if (this->sizes_ != (int *)0x0) {
    return this->sizes_;
  }
  iVar12 = this->children_;
  iVar8 = iVar12 * 4 + 8;
  uVar9 = 0xffffffffffffffff;
  if (-1 < iVar8) {
    uVar9 = (long)iVar8 * 4;
  }
  piVar3 = (int *)operator_new__(uVar9);
  this->sizes_ = piVar3;
  iVar8 = 0;
  iVar4 = 0;
  if ((this->super_Fl_Widget).type_ < 0xf0) {
    iVar8 = (this->super_Fl_Widget).x_;
    iVar4 = (this->super_Fl_Widget).y_;
  }
  *piVar3 = iVar8;
  piVar3[2] = iVar4;
  iVar10 = (this->super_Fl_Widget).w_ + iVar8;
  piVar3[1] = iVar10;
  iVar6 = (this->super_Fl_Widget).h_ + iVar4;
  piVar3[3] = iVar6;
  piVar3[4] = iVar8;
  piVar3[5] = iVar10;
  piVar3[6] = iVar4;
  piVar3[7] = iVar6;
  pFVar1 = (Fl_Group *)this->resizable_;
  if (pFVar1 != this && pFVar1 != (Fl_Group *)0x0) {
    iVar11 = (pFVar1->super_Fl_Widget).x_;
    if (iVar8 < iVar11) {
      piVar3[4] = iVar11;
    }
    iVar11 = iVar11 + (pFVar1->super_Fl_Widget).w_;
    if (iVar11 < iVar10) {
      piVar3[5] = iVar11;
    }
    iVar8 = (pFVar1->super_Fl_Widget).y_;
    if (iVar4 < iVar8) {
      piVar3[6] = iVar8;
    }
    iVar8 = iVar8 + (pFVar1->super_Fl_Widget).h_;
    if (iVar8 < iVar6) {
      piVar3[7] = iVar8;
    }
  }
  if (iVar12 < 2) {
    pppFVar7 = &this->array_;
  }
  else {
    pppFVar7 = (Fl_Widget ***)this->array_;
  }
  lVar5 = 0x10;
  while (bVar13 = iVar12 != 0, iVar12 = iVar12 + -1, bVar13) {
    lVar2 = *(long *)((long)pppFVar7 + lVar5 + -0x10);
    iVar8 = *(int *)(lVar2 + 0x20);
    *(int *)((long)piVar3 + lVar5 * 2) = iVar8;
    *(int *)((long)piVar3 + lVar5 * 2 + 4) = iVar8 + *(int *)(lVar2 + 0x28);
    iVar8 = *(int *)(lVar2 + 0x24);
    *(int *)((long)piVar3 + lVar5 * 2 + 8) = iVar8;
    *(int *)((long)piVar3 + lVar5 * 2 + 0xc) = iVar8 + *(int *)(lVar2 + 0x2c);
    lVar5 = lVar5 + 8;
  }
  return piVar3;
}

Assistant:

int* Fl_Group::sizes() {
  if (!sizes_) {
    int* p = sizes_ = new int[4*(children_+2)];
    // first thing in sizes array is the group's size:
    if (type() < FL_WINDOW) {p[0] = x(); p[2] = y();} else {p[0] = p[2] = 0;}
    p[1] = p[0]+w(); p[3] = p[2]+h();
    // next is the resizable's size:
    p[4] = p[0]; // init to the group's size
    p[5] = p[1];
    p[6] = p[2];
    p[7] = p[3];
    Fl_Widget* r = resizable();
    if (r && r != this) { // then clip the resizable to it
      int t;
      t = r->x(); if (t > p[0]) p[4] = t;
      t +=r->w(); if (t < p[1]) p[5] = t;
      t = r->y(); if (t > p[2]) p[6] = t;
      t +=r->h(); if (t < p[3]) p[7] = t;
    }
    // next is all the children's sizes:
    p += 8;
    Fl_Widget*const* a = array();
    for (int i=children_; i--;) {
      Fl_Widget* o = *a++;
      *p++ = o->x();
      *p++ = o->x()+o->w();
      *p++ = o->y();
      *p++ = o->y()+o->h();
    }
  }
  return sizes_;
}